

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void update_call_mem_live(gen_ctx_t gen_ctx,bitmap_t mem_live,MIR_insn_t call_insn)

{
  int iVar1;
  size_t sVar2;
  mem_attr_t *pmVar3;
  ulong local_30;
  size_t i;
  mem_attr_t *mem_attr_addr;
  MIR_insn_t call_insn_local;
  bitmap_t mem_live_local;
  gen_ctx_t gen_ctx_local;
  
  iVar1 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&call_insn->field_0x18);
  if (iVar1 == 0) {
    __assert_fail("MIR_call_code_p (call_insn->code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1366,"void update_call_mem_live(gen_ctx_t, bitmap_t, MIR_insn_t)");
  }
  if (((*(ushort *)&call_insn->ops[0].field_0x8 & 0xff) == 8) &&
     ((call_insn->ops[0].u.ref)->item_type == MIR_proto_item)) {
    if ((gen_ctx->full_escape_p == '\0') && (iVar1 = alloca_arg_p(gen_ctx,call_insn), iVar1 == 0)) {
      pmVar3 = VARR_mem_attr_taddr(gen_ctx->mem_attrs);
      for (local_30 = 1; sVar2 = VARR_mem_attr_tlength(gen_ctx->mem_attrs), local_30 < sVar2;
          local_30 = local_30 + 1) {
        if (pmVar3[local_30].alloca_flag == '\0') {
          bitmap_set_bit_p(mem_live,local_30);
        }
      }
    }
    else {
      sVar2 = VARR_mem_attr_tlength(gen_ctx->mem_attrs);
      bitmap_set_bit_range_p(mem_live,1,sVar2);
    }
    return;
  }
  __assert_fail("call_insn->ops[0].mode == MIR_OP_REF && call_insn->ops[0].u.ref->item_type == MIR_proto_item"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1368,"void update_call_mem_live(gen_ctx_t, bitmap_t, MIR_insn_t)");
}

Assistant:

static void update_call_mem_live (gen_ctx_t gen_ctx, bitmap_t mem_live, MIR_insn_t call_insn) {
  gen_assert (MIR_call_code_p (call_insn->code));
  gen_assert (call_insn->ops[0].mode == MIR_OP_REF
              && call_insn->ops[0].u.ref->item_type == MIR_proto_item);
  if (full_escape_p || alloca_arg_p (gen_ctx, call_insn)) {
    bitmap_set_bit_range_p (mem_live, 1, VARR_LENGTH (mem_attr_t, mem_attrs));
  } else {
    mem_attr_t *mem_attr_addr = VARR_ADDR (mem_attr_t, mem_attrs);

    for (size_t i = 1; i < VARR_LENGTH (mem_attr_t, mem_attrs); i++)
      if (!mem_attr_addr[i].alloca_flag) bitmap_set_bit_p (mem_live, i);
  }
}